

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sql.cpp
# Opt level: O3

void generate_tree_rules(vector<IsoTree,_std::allocator<IsoTree>_> *trees,
                        vector<IsoHPlane,_std::allocator<IsoHPlane>_> *hplanes,bool output_score,
                        size_t curr_ix,bool index1,string *prev_cond,
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *node_rules,
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *conditions_left,
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *conditions_right,IsoForest *model_outputs,ExtIsoForest *model_outputs_ext)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  bool bVar4;
  char cVar5;
  long *plVar6;
  size_t *psVar7;
  undefined8 *puVar8;
  size_type *psVar9;
  ulong uVar10;
  char cVar11;
  undefined8 uVar12;
  _Alloc_hider _Var13;
  ulong uVar14;
  undefined4 uVar15;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_2;
  string cond_right;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_3;
  string cond_left;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string __str_1;
  
  if (((trees == (vector<IsoTree,_std::allocator<IsoTree>_> *)0x0) ||
      ((trees->super__Vector_base<IsoTree,_std::allocator<IsoTree>_>)._M_impl.
       super__Vector_impl_data._M_start[curr_ix].tree_left != 0)) &&
     ((hplanes == (vector<IsoHPlane,_std::allocator<IsoHPlane>_> *)0x0 ||
      ((hplanes->super__Vector_base<IsoHPlane,_std::allocator<IsoHPlane>_>)._M_impl.
       super__Vector_impl_data._M_start[curr_ix].hplane_left != 0)))) {
    __str_2._M_dataplus._M_p = (pointer)&__str_2.field_2;
    pcVar3 = (prev_cond->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__str_2,pcVar3,pcVar3 + prev_cond->_M_string_length);
    std::__cxx11::string::append((char *)&__str_2);
    plVar6 = (long *)std::__cxx11::string::_M_append
                               ((char *)&__str_2,
                                (ulong)(conditions_left->
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       )._M_impl.super__Vector_impl_data._M_start[curr_ix].
                                       _M_dataplus._M_p);
    psVar9 = (size_type *)(plVar6 + 2);
    if ((size_type *)*plVar6 == psVar9) {
      cond_right.field_2._M_allocated_capacity = *psVar9;
      cond_right.field_2._8_8_ = plVar6[3];
      cond_right._M_dataplus._M_p = (pointer)&cond_right.field_2;
    }
    else {
      cond_right.field_2._M_allocated_capacity = *psVar9;
      cond_right._M_dataplus._M_p = (pointer)*plVar6;
    }
    cond_right._M_string_length = plVar6[1];
    *plVar6 = (long)psVar9;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::append((char *)&cond_right);
    cond_left._M_dataplus._M_p = (pointer)&cond_left.field_2;
    psVar9 = (size_type *)(plVar6 + 2);
    if ((size_type *)*plVar6 == psVar9) {
      cond_left.field_2._M_allocated_capacity = *psVar9;
      cond_left.field_2._8_8_ = plVar6[3];
    }
    else {
      cond_left.field_2._M_allocated_capacity = *psVar9;
      cond_left._M_dataplus._M_p = (pointer)*plVar6;
    }
    cond_left._M_string_length = plVar6[1];
    *plVar6 = (long)psVar9;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)cond_right._M_dataplus._M_p != &cond_right.field_2) {
      operator_delete(cond_right._M_dataplus._M_p,cond_right.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)__str_2._M_dataplus._M_p != &__str_2.field_2) {
      operator_delete(__str_2._M_dataplus._M_p,__str_2.field_2._M_allocated_capacity + 1);
    }
    if (trees == (vector<IsoTree,_std::allocator<IsoTree>_> *)0x0) {
      psVar7 = &(hplanes->super__Vector_base<IsoHPlane,_std::allocator<IsoHPlane>_>)._M_impl.
                super__Vector_impl_data._M_start[curr_ix].hplane_left;
    }
    else {
      psVar7 = &(trees->super__Vector_base<IsoTree,_std::allocator<IsoTree>_>)._M_impl.
                super__Vector_impl_data._M_start[curr_ix].tree_left;
    }
    generate_tree_rules(trees,hplanes,output_score,*psVar7,index1,&cond_left,node_rules,
                        conditions_left,conditions_right,model_outputs,model_outputs_ext);
    cond_left._M_string_length = 0;
    *cond_left._M_dataplus._M_p = '\0';
    __str_3._M_dataplus._M_p = (pointer)&__str_3.field_2;
    pcVar3 = (prev_cond->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__str_3,pcVar3,pcVar3 + prev_cond->_M_string_length);
    std::__cxx11::string::append((char *)&__str_3);
    plVar6 = (long *)std::__cxx11::string::_M_append
                               ((char *)&__str_3,
                                (ulong)(conditions_right->
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       )._M_impl.super__Vector_impl_data._M_start[curr_ix].
                                       _M_dataplus._M_p);
    psVar9 = (size_type *)(plVar6 + 2);
    if ((size_type *)*plVar6 == psVar9) {
      __str_2.field_2._M_allocated_capacity = *psVar9;
      __str_2.field_2._8_8_ = plVar6[3];
      __str_2._M_dataplus._M_p = (pointer)&__str_2.field_2;
    }
    else {
      __str_2.field_2._M_allocated_capacity = *psVar9;
      __str_2._M_dataplus._M_p = (pointer)*plVar6;
    }
    __str_2._M_string_length = plVar6[1];
    *plVar6 = (long)psVar9;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::append((char *)&__str_2);
    cond_right._M_dataplus._M_p = (pointer)&cond_right.field_2;
    psVar9 = (size_type *)(plVar6 + 2);
    if ((size_type *)*plVar6 == psVar9) {
      cond_right.field_2._M_allocated_capacity = *psVar9;
      cond_right.field_2._8_8_ = plVar6[3];
    }
    else {
      cond_right.field_2._M_allocated_capacity = *psVar9;
      cond_right._M_dataplus._M_p = (pointer)*plVar6;
    }
    cond_right._M_string_length = plVar6[1];
    *plVar6 = (long)psVar9;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)__str_2._M_dataplus._M_p != &__str_2.field_2) {
      operator_delete(__str_2._M_dataplus._M_p,__str_2.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)__str_3._M_dataplus._M_p != &__str_3.field_2) {
      operator_delete(__str_3._M_dataplus._M_p,__str_3.field_2._M_allocated_capacity + 1);
    }
    if (trees == (vector<IsoTree,_std::allocator<IsoTree>_> *)0x0) {
      psVar7 = &(hplanes->super__Vector_base<IsoHPlane,_std::allocator<IsoHPlane>_>)._M_impl.
                super__Vector_impl_data._M_start[curr_ix].hplane_right;
    }
    else {
      psVar7 = &(trees->super__Vector_base<IsoTree,_std::allocator<IsoTree>_>)._M_impl.
                super__Vector_impl_data._M_start[curr_ix].tree_right;
    }
    generate_tree_rules(trees,hplanes,output_score,*psVar7,index1,&cond_right,node_rules,
                        conditions_left,conditions_right,model_outputs,model_outputs_ext);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)cond_right._M_dataplus._M_p != &cond_right.field_2) {
      operator_delete(cond_right._M_dataplus._M_p,cond_right.field_2._M_allocated_capacity + 1);
    }
    __str.field_2._M_allocated_capacity = cond_left.field_2._M_allocated_capacity;
    _Var13._M_p = cond_left._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)cond_left._M_dataplus._M_p == &cond_left.field_2) {
      return;
    }
    goto LAB_003553b9;
  }
  __str._M_dataplus._M_p = (pointer)&__str.field_2;
  pcVar3 = (prev_cond->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&__str,pcVar3,pcVar3 + prev_cond->_M_string_length);
  std::__cxx11::string::append((char *)&__str);
  if (output_score) {
    if (trees == (vector<IsoTree,_std::allocator<IsoTree>_> *)0x0) {
      if ((model_outputs_ext->scoring_metric == Density) ||
         (model_outputs_ext->scoring_metric == BoxedRatio)) {
        uVar15 = SUB84((hplanes->super__Vector_base<IsoHPlane,_std::allocator<IsoHPlane>_>)._M_impl.
                       super__Vector_impl_data._M_start[curr_ix].score,0);
      }
      else {
        uVar15 = SUB84((hplanes->super__Vector_base<IsoHPlane,_std::allocator<IsoHPlane>_>)._M_impl.
                       super__Vector_impl_data._M_start[curr_ix].score,0);
      }
    }
    else if ((model_outputs->scoring_metric == Density) ||
            (model_outputs->scoring_metric == BoxedRatio)) {
      uVar15 = SUB84((trees->super__Vector_base<IsoTree,_std::allocator<IsoTree>_>)._M_impl.
                     super__Vector_impl_data._M_start[curr_ix].score,0);
    }
    else {
      uVar15 = SUB84((trees->super__Vector_base<IsoTree,_std::allocator<IsoTree>_>)._M_impl.
                     super__Vector_impl_data._M_start[curr_ix].score,0);
    }
    __gnu_cxx::__to_xstring<std::__cxx11::string,char>(&local_70,vsnprintf,0x148,"%f",uVar15);
  }
  else {
    uVar14 = (ulong)index1 +
             ((long)(node_rules->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
              (long)(node_rules->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start >> 5);
    cVar11 = '\x01';
    if (9 < uVar14) {
      uVar10 = uVar14;
      cVar5 = '\x04';
      do {
        cVar11 = cVar5;
        if (uVar10 < 100) {
          cVar11 = cVar11 + -2;
          goto LAB_00355006;
        }
        if (uVar10 < 1000) {
          cVar11 = cVar11 + -1;
          goto LAB_00355006;
        }
        if (uVar10 < 10000) goto LAB_00355006;
        bVar4 = 99999 < uVar10;
        uVar10 = uVar10 / 10000;
        cVar5 = cVar11 + '\x04';
      } while (bVar4);
      cVar11 = cVar11 + '\x01';
    }
LAB_00355006:
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct((ulong)&local_70,cVar11);
    std::__detail::__to_chars_10_impl<unsigned_long>
              (local_70._M_dataplus._M_p,(uint)local_70._M_string_length,uVar14);
  }
  uVar14 = CONCAT44(local_70._M_string_length._4_4_,(uint)local_70._M_string_length) +
           __str._M_string_length;
  uVar12 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)__str._M_dataplus._M_p != &__str.field_2) {
    uVar12 = __str.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar12 < uVar14) {
    uVar12 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      uVar12 = local_70.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar12 < uVar14) goto LAB_00355094;
    puVar8 = (undefined8 *)
             std::__cxx11::string::replace
                       ((ulong)&local_70,0,(char *)0x0,(ulong)__str._M_dataplus._M_p);
  }
  else {
LAB_00355094:
    puVar8 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&__str,(ulong)local_70._M_dataplus._M_p);
  }
  __str_3._M_dataplus._M_p = (pointer)&__str_3.field_2;
  psVar9 = puVar8 + 2;
  if ((size_type *)*puVar8 == psVar9) {
    __str_3.field_2._M_allocated_capacity = *psVar9;
    __str_3.field_2._8_8_ = puVar8[3];
  }
  else {
    __str_3.field_2._M_allocated_capacity = *psVar9;
    __str_3._M_dataplus._M_p = (pointer)*puVar8;
  }
  __str_3._M_string_length = puVar8[1];
  *puVar8 = psVar9;
  puVar8[1] = 0;
  *(char *)psVar9 = '\0';
  plVar6 = (long *)std::__cxx11::string::append((char *)&__str_3);
  paVar1 = &__str_2.field_2;
  psVar9 = (size_type *)(plVar6 + 2);
  if ((size_type *)*plVar6 == psVar9) {
    __str_2.field_2._M_allocated_capacity = *psVar9;
    __str_2.field_2._8_8_ = plVar6[3];
    __str_2._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    __str_2.field_2._M_allocated_capacity = *psVar9;
    __str_2._M_dataplus._M_p = (pointer)*plVar6;
  }
  __str_2._M_string_length = plVar6[1];
  *plVar6 = (long)psVar9;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  uVar14 = (ulong)index1 +
           ((long)(node_rules->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish -
            (long)(node_rules->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start >> 5);
  cVar11 = '\x01';
  if (9 < uVar14) {
    uVar10 = uVar14;
    cVar5 = '\x04';
    do {
      cVar11 = cVar5;
      if (uVar10 < 100) {
        cVar11 = cVar11 + -2;
        goto LAB_003551bd;
      }
      if (uVar10 < 1000) {
        cVar11 = cVar11 + -1;
        goto LAB_003551bd;
      }
      if (uVar10 < 10000) goto LAB_003551bd;
      bVar4 = 99999 < uVar10;
      uVar10 = uVar10 / 10000;
      cVar5 = cVar11 + '\x04';
    } while (bVar4);
    cVar11 = cVar11 + '\x01';
  }
LAB_003551bd:
  paVar2 = &__str_1.field_2;
  __str_1._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct((ulong)&__str_1,cVar11);
  std::__detail::__to_chars_10_impl<unsigned_long>
            (__str_1._M_dataplus._M_p,(uint)__str_1._M_string_length,uVar14);
  uVar14 = CONCAT44(__str_1._M_string_length._4_4_,(uint)__str_1._M_string_length) +
           __str_2._M_string_length;
  uVar12 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)__str_2._M_dataplus._M_p != paVar1) {
    uVar12 = __str_2.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar12 < uVar14) {
    uVar12 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)__str_1._M_dataplus._M_p != paVar2) {
      uVar12 = __str_1.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar12 < uVar14) goto LAB_0035523b;
    puVar8 = (undefined8 *)
             std::__cxx11::string::replace
                       ((ulong)&__str_1,0,(char *)0x0,(ulong)__str_2._M_dataplus._M_p);
  }
  else {
LAB_0035523b:
    puVar8 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&__str_2,(ulong)__str_1._M_dataplus._M_p);
  }
  cond_right._M_dataplus._M_p = (pointer)&cond_right.field_2;
  psVar9 = puVar8 + 2;
  if ((size_type *)*puVar8 == psVar9) {
    cond_right.field_2._M_allocated_capacity = *psVar9;
    cond_right.field_2._8_8_ = puVar8[3];
  }
  else {
    cond_right.field_2._M_allocated_capacity = *psVar9;
    cond_right._M_dataplus._M_p = (pointer)*puVar8;
  }
  cond_right._M_string_length = puVar8[1];
  *puVar8 = psVar9;
  puVar8[1] = 0;
  *(char *)psVar9 = '\0';
  plVar6 = (long *)std::__cxx11::string::append((char *)&cond_right);
  psVar9 = (size_type *)(plVar6 + 2);
  if ((size_type *)*plVar6 == psVar9) {
    cond_left.field_2._M_allocated_capacity = *psVar9;
    cond_left.field_2._8_8_ = plVar6[3];
    cond_left._M_dataplus._M_p = (pointer)&cond_left.field_2;
  }
  else {
    cond_left.field_2._M_allocated_capacity = *psVar9;
    cond_left._M_dataplus._M_p = (pointer)*plVar6;
  }
  cond_left._M_string_length = plVar6[1];
  *plVar6 = (long)psVar9;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)node_rules,
             &cond_left);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)cond_left._M_dataplus._M_p != &cond_left.field_2) {
    operator_delete(cond_left._M_dataplus._M_p,cond_left.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)cond_right._M_dataplus._M_p != &cond_right.field_2) {
    operator_delete(cond_right._M_dataplus._M_p,cond_right.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)__str_1._M_dataplus._M_p != paVar2) {
    operator_delete(__str_1._M_dataplus._M_p,__str_1.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)__str_2._M_dataplus._M_p != paVar1) {
    operator_delete(__str_2._M_dataplus._M_p,__str_2.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)__str_3._M_dataplus._M_p != &__str_3.field_2) {
    operator_delete(__str_3._M_dataplus._M_p,__str_3.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  _Var13._M_p = __str._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)__str._M_dataplus._M_p == &__str.field_2) {
    return;
  }
LAB_003553b9:
  operator_delete(_Var13._M_p,__str.field_2._M_allocated_capacity + 1);
  return;
}

Assistant:

void generate_tree_rules(const std::vector<IsoTree> *trees, const std::vector<IsoHPlane> *hplanes, const bool output_score,
                         const size_t curr_ix, const bool index1, const std::string &prev_cond,
                         std::vector<std::string> &node_rules,
                         std::vector<std::string> &conditions_left, std::vector<std::string> &conditions_right,
                         const IsoForest *model_outputs, const ExtIsoForest *model_outputs_ext)
{
    // if ((trees != NULL && (*trees)[curr_ix].score >= 0) ||
    //     (hplanes != NULL && (*hplanes)[curr_ix].score >= 0))
    if ((trees != NULL && (*trees)[curr_ix].tree_left == 0) ||
        (hplanes != NULL && (*hplanes)[curr_ix].hplane_left == 0))
    {
        node_rules.push_back(prev_cond
                                + "\tTHEN "
                                + (output_score?
                                    (std::to_string((trees != NULL)?
                                        ((model_outputs->scoring_metric != Density && model_outputs->scoring_metric != BoxedRatio)?
                                            (*trees)[curr_ix].score : (-(*trees)[curr_ix].score))
                                            :
                                        ((model_outputs_ext->scoring_metric != Density && model_outputs_ext->scoring_metric != BoxedRatio)?
                                            (*hplanes)[curr_ix].score : (-(*hplanes)[curr_ix].score))))
                                        :
                                    (std::to_string(node_rules.size() + (size_t)index1)))
                                + "\n---end of terminal node "
                                + std::to_string(node_rules.size() + (size_t)index1)
                                + "---\n");
        return;
    }

    
    std::string cond_left = prev_cond
                                + ((curr_ix > 0)? "\t\tAND (" : "\t\t    (")
                                + conditions_left[curr_ix]
                                + ")\n";
    generate_tree_rules(trees, hplanes, output_score,
                        (trees != NULL)?
                            ((*trees)[curr_ix].tree_left) : ((*hplanes)[curr_ix].hplane_left),
                        index1, cond_left, node_rules,
                        conditions_left, conditions_right, model_outputs, model_outputs_ext);
    cond_left.clear();
    std::string cond_right = prev_cond
                                + ((curr_ix > 0)? "\t\tAND (" : "\t\t    (")
                                + conditions_right[curr_ix]
                                + ")\n";
    generate_tree_rules(trees, hplanes, output_score,
                        (trees != NULL)?
                            ((*trees)[curr_ix].tree_right) : ((*hplanes)[curr_ix].hplane_right),
                        index1, cond_right, node_rules,
                        conditions_left, conditions_right, model_outputs, model_outputs_ext);
}